

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Observer.cpp
# Opt level: O2

void * ObserverThread(void *pParam)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  BOOL BVar6;
  char *pcVar7;
  FILE *pFVar8;
  interval *piVar9;
  double *pdVar10;
  vector<interval,_std::allocator<interval>_> *pvVar11;
  vector<interval,_std::allocator<interval>_> *this;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  double local_8f8;
  box p;
  box pdot;
  box Vr;
  interval local_898;
  double local_880;
  FILE *local_878;
  interval local_870;
  double local_858;
  double local_850;
  double local_848;
  double local_840;
  double local_838;
  double local_830;
  undefined1 local_828 [16];
  undefined1 local_818 [12];
  undefined4 uStack_80c;
  interval local_808;
  interval local_7f0;
  double althat;
  double longhat;
  double lathat;
  interval local_7c0;
  imatrix R_Euler;
  interval xhat_prev;
  timeval local_748;
  double local_730;
  double local_728;
  double local_720;
  double local_718;
  double local_710;
  double local_708;
  double local_700;
  double local_6f8;
  double local_6f0;
  double local_6e8;
  double local_6e0;
  double local_6d8;
  double local_6d0;
  double local_6c8;
  double local_6c0;
  double local_6b8;
  double local_6b0;
  double local_6a8;
  double local_6a0;
  double local_698;
  double local_690;
  double local_688;
  double local_680;
  double local_678;
  double local_670;
  double local_668;
  double local_660;
  double local_658;
  double local_650;
  double local_648;
  double local_640;
  double local_638;
  double local_630;
  double local_628;
  double local_620;
  double local_618;
  double local_610;
  double local_608;
  double local_600;
  double local_5f8;
  double local_5f0;
  double local_5e8;
  double local_5e0;
  double local_5d8;
  double local_5d0;
  double local_5c8;
  double local_5c0;
  double local_5b8;
  double local_5b0;
  double local_5a8;
  double local_5a0;
  double local_598;
  double local_590;
  double local_588;
  double local_580;
  double local_578;
  double local_570;
  double local_568;
  double local_560;
  double local_558;
  double local_550;
  double local_548;
  double local_540;
  double local_538;
  double local_530;
  double local_528;
  double local_520;
  double local_518;
  interval yhat_prev;
  interval local_4f8;
  interval local_4e0;
  interval local_4c8;
  interval local_4b0;
  interval local_498;
  interval local_480;
  interval psihat_prev;
  interval zhat_prev;
  interval local_438;
  interval local_420;
  interval local_408;
  interval local_3f0;
  interval local_3d8;
  interval local_3c0;
  interval local_3a8;
  interval local_390;
  interval local_378;
  interval local_360;
  interval local_348;
  interval local_330;
  interval local_318;
  interval local_300;
  interval local_2e8;
  interval local_2d0;
  interval local_2b8;
  interval local_2a0;
  interval local_288;
  interval local_270;
  interval local_258;
  interval omegazhat_prev;
  interval vrxhat_prev;
  CHRONO chrono;
  CHRONO chrono_omegaz;
  CHRONO chrono_v;
  char logstatefilename [256];
  
  lathat = 0.0;
  longhat = 0.0;
  althat = 0.0;
  if (bDisablelogstate == 0) {
    pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
    pcVar7 = strtimeex_fns();
    sprintf(logstatefilename,"log/logstate_%.64s.csv",pcVar7);
    pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
    pFVar8 = fopen(logstatefilename,"w");
    if (pFVar8 == (FILE *)0x0) {
      puts("Unable to create log file.");
      goto LAB_00109baa;
    }
    fwrite("t_epoch (in s);lat;lon;alt_amsl;hdg;cog;sog;alt_agl;pressure (in bar);fluiddira (in deg);fluidspeeda;fluiddir (in deg);fluidspeed;range;bearing (in deg);elevation (in deg);utc (in ms);t_app (in s);xhat;yhat;zhat;phihat;thetahat;psihat;vrxhat;vryhat;vrzhat;omegaxhat;omegayhat;omegazhat;accrxhat;accryhat;accrzhat;xhat_err;yhat_err;zhat_err;phihat_err;thetahat_err;psihat_err;vrxhat_err;vryhat_err;vrzhat_err;omegaxhat_err;omegayhat_err;omegazhat_err;accrxhat_err;accryhat_err;accrzhat_err;wx;wy;wz;wphi;wtheta;wpsi;wd;wu;wagl;uvx;uvy;uvz;uwx;uwy;uwz;u1;u2;u3;u4;u5;u6;u7;u8;u9;u10;u11;u12;u13;u14;EPU1;EPU2;\n"
           ,0x260,1,pFVar8);
    local_878 = pFVar8;
    fflush(pFVar8);
  }
  else {
    local_878 = (FILE *)0x0;
  }
  pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
  psitwind = psitwind_med;
  vtwind = vtwind_med;
  dVar1 = cos(psitwind_med);
  local_818._8_4_ = extraout_XMM0_Dc;
  local_818._0_8_ = dVar1;
  uStack_80c = extraout_XMM0_Dd;
  dVar1 = sin(psitwind);
  dVar2 = atan2(dVar1,(double)local_818._0_8_);
  xhat_prev.inf = fmod_2PI(dVar2);
  interval::interval((interval *)&R_Euler,&xhat_prev.inf);
  interval::operator=((interval *)&psitwindhat,(interval *)&R_Euler);
  interval::interval((interval *)&R_Euler,&vtwind);
  interval::operator=((interval *)&vtwindhat,(interval *)&R_Euler);
  pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
  bGPSLocalization = 1;
  local_858 = 0.0;
  bDVLLocalization = bGPSLocalization;
  StartChrono(&chrono);
  StartChrono(&chrono_v);
  StartChrono(&chrono_omegaz);
  local_818._8_4_ = SUB84(dVar1,0);
  uStack_80c = (int)((ulong)dVar1 >> 0x20);
  do {
    uSleep((long)observerperiod * 1000);
    local_880 = local_858;
    GetTimeElapsedChrono(&chrono,&local_858);
    dVar1 = local_858;
    iVar5 = gettimeofday(&local_748,(__timezone_ptr_t)0x0);
    if (iVar5 == 0) {
      local_850 = (double)local_748.tv_sec;
      local_830 = (double)local_748.tv_usec;
    }
    else {
      local_748.tv_sec = 0;
      local_748.tv_usec = 0;
      local_830 = 0.0;
      local_850 = 0.0;
    }
    local_830 = local_830 * 1e-06;
    pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
    interval::interval(&xhat_prev,(interval *)&xhat);
    interval::interval(&yhat_prev,(interval *)&yhat);
    interval::interval(&zhat_prev,(interval *)&zhat);
    interval::interval(&psihat_prev,(interval *)&psihat);
    interval::interval(&vrxhat_prev,(interval *)&vrxhat);
    interval::interval(&omegazhat_prev,(interval *)&omegazhat);
    Vr.data = (interval *)(vc_med - vc_var);
    pdot.data = (interval *)(vc_med + vc_var);
    interval::interval((interval *)&R_Euler,(double *)&Vr,(double *)&pdot);
    interval::operator=((interval *)&vchat,(interval *)&R_Euler);
    Vr.data = (interval *)(psic_med - psic_var);
    pdot.data = (interval *)(psic_med + psic_var);
    interval::interval((interval *)&R_Euler,(double *)&Vr,(double *)&pdot);
    interval::operator=((interval *)&psichat,(interval *)&R_Euler);
    Vr.data = (interval *)((ulong)hw_var ^ 0x8000000000000000);
    interval::interval((interval *)&R_Euler,(double *)&Vr,&hw_var);
    interval::operator=((interval *)&hwhat,(interval *)&R_Euler);
    dVar3 = wind_filter_coef;
    dVar2 = cos(psitwind);
    dVar4 = wind_filter_coef;
    local_828._8_4_ = extraout_XMM0_Dc_00;
    local_828._0_8_ = dVar2;
    local_828._12_4_ = extraout_XMM0_Dd_00;
    dVar2 = sin(psitwind);
    local_818._0_8_ = (double)local_818._0_8_ * dVar3 + (double)local_828._0_8_ * (1.0 - dVar3);
    register0x00001248 = stack0xfffffffffffff7f0 * dVar4 + dVar2 * (1.0 - dVar4);
    dVar2 = atan2(register0x00001248,(double)local_818._0_8_);
    p.data = (interval *)fmod_2PI(dVar2);
    interval::interval((interval *)&Vr,(double *)&p);
    local_898.inf = -psitwind_var;
    interval::interval((interval *)&pdot,&local_898.inf,&psitwind_var);
    operator+((interval *)&Vr,(interval *)&pdot);
    interval::operator=((interval *)&psitwindhat,(interval *)&R_Euler);
    dVar3 = wind_filter_coef;
    dVar2 = Center((interval *)&vtwindhat);
    p.data = (interval *)(dVar2 * dVar3 + (1.0 - wind_filter_coef) * vtwind);
    interval::interval((interval *)&Vr,(double *)&p);
    local_898.inf = -vtwind_var;
    interval::interval((interval *)&pdot,&local_898.inf,&vtwind_var);
    operator+((interval *)&Vr,(interval *)&pdot);
    interval::operator=((interval *)&vtwindhat,(interval *)&R_Euler);
    if (psi_source == 1) {
      pvVar11 = &psi_ahrs;
      if (GPS_SOG_for_valid_COG <= sog) {
        pvVar11 = &cog_gps;
      }
    }
    else {
      pvVar11 = &psi_ahrs;
      if ((psi_source == 2) && (pvVar11 = &psi_ahrs, GPS_SOG_for_valid_COG <= sog)) {
        pvVar11 = &psi_dvl;
      }
    }
    dVar1 = dVar1 - local_880;
    interval::operator=((interval *)&psihat,(interval *)pvVar11);
    interval::operator=((interval *)&omegaxhat,(interval *)&omegax_ahrs);
    interval::operator=((interval *)&omegayhat,(interval *)&omegay_ahrs);
    interval::operator=((interval *)&accrxhat,(interval *)&accrx_ahrs);
    interval::operator=((interval *)&accryhat,(interval *)&accry_ahrs);
    interval::operator=((interval *)&accrzhat,(interval *)&accrz_ahrs);
    if ((char)robid == '\0') {
      if (((robid == 0x100) || (robid == 0x200)) || (robid == 0x400)) {
LAB_00107ce5:
        interval::operator=((interval *)&xhat,(interval *)&x_gps);
        interval::operator=((interval *)&yhat,(interval *)&y_gps);
        interval::operator=((interval *)&zhat,(interval *)&z_gps);
        interval::operator=((interval *)&phihat,(interval *)&phi_ahrs);
        interval::operator=((interval *)&thetahat,(interval *)&theta_ahrs);
        operator-((interval *)&pdot,(interval *)&xhat,&xhat_prev);
        dVar2 = Center((interval *)&pdot);
        operator-((interval *)&p,(interval *)&yhat,&yhat_prev);
        dVar3 = Center((interval *)&p);
        local_898.inf = SQRT(dVar3 * dVar3 + dVar2 * dVar2) / dVar1;
        interval::interval((interval *)&Vr,&local_898.inf);
        operator+((interval *)&Vr,(interval *)&vrxdotnoise);
        interval::operator=((interval *)&vrxhat,(interval *)&R_Euler);
        this = &omegazhat;
        pvVar11 = &omegaz_ahrs;
LAB_00107e11:
        interval::operator=((interval *)this,(interval *)pvVar11);
      }
      else {
        if (robid == 0x4000000) {
          interval::operator=((interval *)&vrxhat,(interval *)&vrx_of);
          interval::operator=((interval *)&vryhat,(interval *)&vry_of);
          Cos(&local_870,(interval *)&psihat);
          operator*(&local_898,(interval *)&vrx_of,&local_870);
          Sin(&local_808,(interval *)&psihat);
          operator*(&local_7f0,(interval *)&vry_of,&local_808);
          operator-((interval *)&p,&local_898,&local_7f0);
          operator+((interval *)&p,(interval *)&xdotnoise);
          operator*((interval *)&Vr,dVar1,(interval *)&pdot);
          operator+((interval *)&xhat,(interval *)&Vr);
          interval::operator=((interval *)&xhat,(interval *)&R_Euler);
          Sin(&local_870,(interval *)&psihat);
          operator*(&local_898,(interval *)&vrx_of,&local_870);
          Cos(&local_808,(interval *)&psihat);
          operator*(&local_7f0,(interval *)&vry_of,&local_808);
          operator+(&local_898,&local_7f0);
          operator+((interval *)&p,(interval *)&ydotnoise);
          operator*((interval *)&Vr,dVar1,(interval *)&pdot);
          operator+((interval *)&yhat,(interval *)&Vr);
          interval::operator=((interval *)&yhat,(interval *)&R_Euler);
          Vr.data = (interval *)(GPS_low_acc * -5.0);
          pdot.data = (interval *)(GPS_low_acc * 5.0);
          interval::interval((interval *)&R_Euler,(double *)&Vr,(double *)&pdot);
          interval::operator=((interval *)&zhat,(interval *)&R_Euler);
          interval::operator=((interval *)&phihat,(interval *)&phi_ahrs);
          interval::operator=((interval *)&thetahat,(interval *)&theta_ahrs);
          operator-((interval *)&pdot,(interval *)&zhat,&zhat_prev);
          dVar2 = Center((interval *)&pdot);
          p.data = (interval *)(dVar2 / dVar1);
          interval::interval((interval *)&Vr,(double *)&p);
          operator+((interval *)&Vr,(interval *)&vrzdotnoise);
          pvVar11 = &vrzhat;
        }
        else {
          if ((robid == 0x100000) || (robid == 0x200000)) {
            operator*(&local_870,(interval *)&alphavrxhat,u_f);
            Cos(&local_7f0,(interval *)&psihat);
            operator*(&local_898,&local_870,&local_7f0);
            operator*(&local_7c0,(interval *)&alphaomegazhat,uw_f);
            Cos(&local_808,&local_7c0);
            operator*((interval *)&p,&local_898,&local_808);
            operator+((interval *)&p,(interval *)&xdotnoise);
            operator*((interval *)&Vr,dVar1,(interval *)&pdot);
            operator+((interval *)&xhat,(interval *)&Vr);
            interval::operator=((interval *)&xhat,(interval *)&R_Euler);
            operator*(&local_870,(interval *)&alphavrxhat,u_f);
            Sin(&local_7f0,(interval *)&psihat);
            operator*(&local_898,&local_870,&local_7f0);
            operator*(&local_7c0,(interval *)&alphaomegazhat,uw_f);
            Cos(&local_808,&local_7c0);
            operator*((interval *)&p,&local_898,&local_808);
            operator+((interval *)&p,(interval *)&ydotnoise);
            operator*((interval *)&Vr,dVar1,(interval *)&pdot);
            operator+((interval *)&yhat,(interval *)&Vr);
            interval::operator=((interval *)&yhat,(interval *)&R_Euler);
            Vr.data = (interval *)(GPS_low_acc * -5.0);
            pdot.data = (interval *)(GPS_low_acc * 5.0);
            interval::interval((interval *)&R_Euler,(double *)&Vr,(double *)&pdot);
            interval::operator=((interval *)&zhat,(interval *)&R_Euler);
            interval::operator=((interval *)&phihat,(interval *)&phi_ahrs);
            interval::operator=((interval *)&thetahat,(interval *)&theta_ahrs);
          }
          else {
            if (robid != 0x20000) goto LAB_00107ce5;
            operator*(&local_898,(interval *)&alphavrxhat,u1 + u2);
            Cos(&local_870,(interval *)&psihat);
            operator*((interval *)&p,&local_898,&local_870);
            operator+((interval *)&p,(interval *)&xdotnoise);
            operator*((interval *)&Vr,dVar1,(interval *)&pdot);
            operator+((interval *)&xhat,(interval *)&Vr);
            interval::operator=((interval *)&xhat,(interval *)&R_Euler);
            operator*(&local_898,(interval *)&alphavrxhat,u1 + u2);
            Sin(&local_870,(interval *)&psihat);
            operator*((interval *)&p,&local_898,&local_870);
            operator+((interval *)&p,(interval *)&ydotnoise);
            operator*((interval *)&Vr,dVar1,(interval *)&pdot);
            operator+((interval *)&yhat,(interval *)&Vr);
            interval::operator=((interval *)&yhat,(interval *)&R_Euler);
            Vr.data = (interval *)(GPS_low_acc * -5.0);
            pdot.data = (interval *)(GPS_low_acc * 5.0);
            interval::interval((interval *)&R_Euler,(double *)&Vr,(double *)&pdot);
            interval::operator=((interval *)&zhat,(interval *)&R_Euler);
            interval::operator=((interval *)&phihat,(interval *)&phi_ahrs);
            interval::operator=((interval *)&thetahat,(interval *)&theta_ahrs);
          }
          operator-((interval *)&pdot,(interval *)&xhat,&xhat_prev);
          dVar2 = Center((interval *)&pdot);
          operator-((interval *)&p,(interval *)&yhat,&yhat_prev);
          dVar3 = Center((interval *)&p);
          local_898.inf = SQRT(dVar3 * dVar3 + dVar2 * dVar2) / dVar1;
          interval::interval((interval *)&Vr,&local_898.inf);
          operator+((interval *)&Vr,(interval *)&vrxdotnoise);
          pvVar11 = &vrxhat;
        }
        interval::operator=((interval *)pvVar11,(interval *)&R_Euler);
        interval::operator=((interval *)&omegazhat,(interval *)&omegaz_ahrs);
        if (bGPSLocalization != 0) {
          BVar6 = bCheckGNSSOK();
          if (BVar6 != 0) {
            operator&((interval *)&R_Euler,(interval *)&xhat,(interval *)&x_gps);
            interval::operator=((interval *)&xhat,(interval *)&R_Euler);
            operator&((interval *)&R_Euler,(interval *)&yhat,(interval *)&y_gps);
            interval::operator=((interval *)&yhat,(interval *)&R_Euler);
            operator&((interval *)&R_Euler,(interval *)&zhat,(interval *)&z_gps);
            interval::operator=((interval *)&zhat,(interval *)&R_Euler);
            if (((char)xhat.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage != '\0') ||
               ((char)yhat.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage == '\x01')) {
              interval::operator=((interval *)&xhat,(interval *)&x_gps);
              interval::operator=((interval *)&yhat,(interval *)&y_gps);
            }
            if ((char)zhat.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage == '\x01') {
              this = &zhat;
              pvVar11 = &z_gps;
              goto LAB_00107e11;
            }
          }
        }
      }
    }
    else {
      if (((bDVLLocalization == 0) || (dVar2 = Width((interval *)&vrx_dvl), dvl_acc * 4.0 < dVar2))
         || (dVar2 = Width((interval *)&vry_dvl), dvl_acc * 4.0 < dVar2)) {
        Cos(&local_870,(interval *)&psihat);
        operator*(&local_898,(interval *)&vrxhat,&local_870);
        Cos(&local_808,(interval *)&psichat);
        operator*(&local_7f0,(interval *)&vchat,&local_808);
        operator+(&local_898,&local_7f0);
        operator+((interval *)&p,(interval *)&xdotnoise);
        operator*((interval *)&Vr,dVar1,(interval *)&pdot);
        operator+((interval *)&xhat,(interval *)&Vr);
        interval::operator=((interval *)&xhat,(interval *)&R_Euler);
        Sin(&local_870,(interval *)&psihat);
        operator*(&local_898,(interval *)&vrxhat,&local_870);
        Sin(&local_808,(interval *)&psichat);
        operator*(&local_7f0,(interval *)&vchat,&local_808);
        operator+(&local_898,&local_7f0);
        operator+((interval *)&p,(interval *)&ydotnoise);
        operator*((interval *)&Vr,dVar1,(interval *)&pdot);
        operator+((interval *)&yhat,(interval *)&Vr);
        interval::operator=((interval *)&yhat,(interval *)&R_Euler);
        operator+((interval *)&z_pressure,(interval *)&hwhat);
        interval::operator=((interval *)&zhat,(interval *)&R_Euler);
        interval::operator=((interval *)&phihat,(interval *)&phi_ahrs);
        interval::operator=((interval *)&thetahat,(interval *)&theta_ahrs);
        local_7c0.inf = 1.0;
        interval::interval(&local_898,&local_7c0.inf);
        operator*(&local_870,dVar1,(interval *)&alphafvrxhat);
        operator-((interval *)&p,&local_898,&local_870);
        operator*((interval *)&pdot,(interval *)&p,(interval *)&vrxhat);
        operator*(&local_7f0,(u1 + u2) * dVar1,(interval *)&alphavrxhat);
        operator+((interval *)&pdot,&local_7f0);
        operator*(&local_808,dVar1,(interval *)&vrxdotnoise);
        operator+((interval *)&Vr,&local_808);
        interval::operator=((interval *)&vrxhat,(interval *)&R_Euler);
      }
      else {
        interval::operator=((interval *)&vrxhat,(interval *)&vrx_dvl);
        interval::operator=((interval *)&vryhat,(interval *)&vry_dvl);
        interval::operator=((interval *)&vrzhat,(interval *)&vrz_dvl);
        operator+((interval *)&z_pressure,(interval *)&hwhat);
        interval::operator=((interval *)&zhat,(interval *)&R_Euler);
        interval::operator=((interval *)&phihat,(interval *)&phi_ahrs);
        interval::operator=((interval *)&thetahat,(interval *)&theta_ahrs);
        RotationPhiThetaPsi(&R_Euler,(interval *)&phihat,(interval *)&thetahat,(interval *)&psihat);
        interval::interval(&local_480,(interval *)&vrxhat);
        interval::interval(&local_498,(interval *)&vryhat);
        interval::interval(&local_4b0,(interval *)&vrzhat);
        box::box(&Vr,(vector<interval,_std::allocator<interval>_> *)&local_480,
                 (vector<interval,_std::allocator<interval>_> *)&local_498,
                 (vector<interval,_std::allocator<interval>_> *)&local_4b0);
        operator*((imatrix *)&pdot,(box *)&R_Euler);
        interval::interval(&local_4c8,(interval *)&xhat);
        interval::interval(&local_4e0,(interval *)&yhat);
        interval::interval(&local_4f8,(interval *)&zhat);
        box::box(&p,(vector<interval,_std::allocator<interval>_> *)&local_4c8,
                 (vector<interval,_std::allocator<interval>_> *)&local_4e0,
                 (vector<interval,_std::allocator<interval>_> *)&local_4f8);
        operator*(dVar1,(box *)&local_870);
        operator+((box *)&local_898,&p);
        box::operator=(&p,(box *)&local_898);
        box::~box((box *)&local_898);
        box::~box((box *)&local_870);
        piVar9 = box::operator[](&p,1);
        interval::operator=((interval *)&xhat,piVar9);
        piVar9 = box::operator[](&p,2);
        interval::operator=((interval *)&yhat,piVar9);
        box::~box(&p);
        box::~box(&pdot);
        box::~box(&Vr);
        imatrix::~imatrix(&R_Euler);
      }
      if ((robid & 0xeU) == 0) {
        if (robid == 1) {
          operator*((interval *)&pdot,u1 - u2,(interval *)&alphaomegazhat);
          operator+((interval *)&pdot,(interval *)&psidotnoise);
          pvVar11 = (vector<interval,_std::allocator<interval>_> *)&R_Euler;
          operator*((interval *)pvVar11,dVar1,(interval *)&Vr);
        }
        else {
          if ((robid == 0x80) || (robid == 0x40)) goto LAB_001078d6;
          operator*((interval *)&Vr,0.8,(interval *)&omegazhat);
          dVar2 = Center((interval *)&psihat);
          dVar3 = Center(&psihat_prev);
          local_7f0.inf = sin(dVar2 - dVar3);
          local_7f0.inf = local_7f0.inf / dVar1;
          interval::interval(&local_898,&local_7f0.inf);
          local_7c0.inf = omegaz_ahrs_acc;
          local_808.inf = -omegaz_ahrs_acc;
          interval::interval(&local_870,&local_808.inf,&local_7c0.inf);
          operator+(&local_898,&local_870);
          operator*((interval *)&pdot,0.2,(interval *)&p);
          pvVar11 = (vector<interval,_std::allocator<interval>_> *)&R_Euler;
          operator+((interval *)&Vr,(interval *)&pdot);
        }
      }
      else {
LAB_001078d6:
        pvVar11 = &omegaz_ahrs;
      }
      interval::operator=((interval *)&omegazhat,(interval *)pvVar11);
      if (bGPSLocalization != 0) {
        BVar6 = bCheckGNSSOK();
        if (BVar6 != 0) {
          dVar2 = Center((interval *)&zhat);
          if (GPS_submarine_depth_limit < dVar2) {
            operator&((interval *)&R_Euler,(interval *)&xhat,(interval *)&x_gps);
            interval::operator=((interval *)&xhat,(interval *)&R_Euler);
            operator&((interval *)&R_Euler,(interval *)&yhat,(interval *)&y_gps);
            interval::operator=((interval *)&yhat,(interval *)&R_Euler);
            if (((char)xhat.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage != '\0') ||
               ((char)yhat.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage == '\x01')) {
              interval::operator=((interval *)&xhat,(interval *)&x_gps);
              this = &yhat;
              pvVar11 = &y_gps;
              goto LAB_00107e11;
            }
          }
        }
      }
    }
    dVar3 = lat_env;
    local_880 = long_env;
    local_828._0_8_ = alt_env;
    local_838 = (double)CONCAT44(angle_env._4_4_,angle_env._0_4_);
    local_840 = Center((interval *)&xhat);
    local_848 = Center((interval *)&yhat);
    dVar2 = Center((interval *)&zhat);
    EnvCoordSystem2GPS(dVar3,local_880,(double)local_828._0_8_,local_838,local_840,local_848,dVar2,
                       &lathat,&longhat,&althat);
    dVar3 = (double)CONCAT44(angle_env._4_4_,angle_env._0_4_);
    dVar2 = Center((interval *)&psihat);
    local_880 = fmod_360_pos_rad2deg((-dVar3 - dVar2) + 1.5707963267948966);
    local_8f8 = -(double)CONCAT44(angle_env._4_4_,angle_env._0_4_);
    dVar2 = Center((interval *)&cog_gps);
    dVar2 = fmod_360_pos_rad2deg((local_8f8 - dVar2) + 1.5707963267948966);
    if (((ulong)(uint)robid < 0x21) && ((0x100000016U >> ((ulong)(uint)robid & 0x3f) & 1) != 0)) {
      EPU1 = ((double)(~-(ulong)(vbat1 != 0.0) & (ulong)P_electronics_4 |
                      (ulong)(vbat1_filtered * ibat1_filtered) & -(ulong)(vbat1 != 0.0)) * dVar1) /
             3600.0 + EPU1;
      if ((vbat2 != 0.0) || (NAN(vbat2))) {
LAB_0010884f:
        dVar3 = vbat2_filtered * ibat2_filtered;
      }
      else {
        dVar3 = u1 + u2;
        pdVar10 = &u3;
LAB_00108cda:
        dVar3 = (dVar3 + *pdVar10) * P_actuators_1;
LAB_00108ce9:
        dVar3 = dVar3 + P_actuators_4;
      }
LAB_00108cf4:
      EPU2 = (dVar1 * dVar3) / 3600.0 + EPU2;
      if ((((robid == 0x200) || (robid == 0x400)) || (robid == 0x2000)) ||
         ((robid == 0x4000 || (robid == 0x8000)))) goto LAB_00108d3b;
    }
    else {
      if (robid == 0x100) {
LAB_00108006:
        EPU1 = ((double)(~-(ulong)(vbat1 != 0.0) & (ulong)P_electronics_4 |
                        (ulong)(vbat1_filtered * ibat1_filtered) & -(ulong)(vbat1 != 0.0)) * dVar1)
               / 3600.0 + EPU1;
        if ((vbat2 == 0.0) && (!NAN(vbat2))) {
          dVar3 = u_f * P_actuators_1 + uw_f * P_actuators_2;
          goto LAB_00108ce9;
        }
        goto LAB_0010884f;
      }
      if (robid == 0x200) {
LAB_00108169:
        EPU1 = ((double)(~-(ulong)(vbat1 != 0.0) & (ulong)P_electronics_4 |
                        (ulong)(vbat1_filtered * ibat1_filtered) & -(ulong)(vbat1 != 0.0)) * dVar1)
               / 3600.0 + EPU1;
        if ((vbat2 == 0.0) && (!NAN(vbat2))) {
          pdVar10 = &u2;
          dVar3 = u1;
          goto LAB_00108cda;
        }
        goto LAB_0010884f;
      }
      if (robid == 0x400) goto LAB_00108006;
      if (robid == 0x1000) {
LAB_001081fc:
        EPU1 = ((double)(~-(ulong)(vbat1 != 0.0) & (ulong)P_electronics_4 |
                        (ulong)(vbat1_filtered * ibat1_filtered) & -(ulong)(vbat1 != 0.0)) * dVar1)
               / 3600.0 + EPU1;
        if ((vbat2 != 0.0) || (dVar3 = P_actuators_4, NAN(vbat2))) goto LAB_0010884f;
        goto LAB_00108cf4;
      }
      if (robid != 0x2000) {
        if ((robid != 0x4000) && (robid != 0x8000)) {
          if ((robid == 0x10000) || (robid == 0x20000)) goto LAB_00108169;
          if ((robid != 0x100000) && (robid != 0x200000)) {
            EPU1 = ((double)(~-(ulong)(vbat1 != 0.0) & (ulong)P_electronics_4 |
                            (ulong)(vbat1_filtered * ibat1_filtered) & -(ulong)(vbat1 != 0.0)) *
                   dVar1) / 3600.0 + EPU1;
            if ((vbat2 == 0.0) && (!NAN(vbat2))) {
              pdVar10 = &ul_f;
              dVar3 = u_f + uw_f + uv_f;
              goto LAB_00108cda;
            }
            goto LAB_0010884f;
          }
          goto LAB_00108006;
        }
        goto LAB_001081fc;
      }
      if ((vbat1 != 0.0) || (NAN(vbat1))) {
        dVar3 = vbat1_filtered * ibat1_filtered;
      }
      else {
        dVar3 = P_electronics_4 + P_actuators_4;
      }
      EPU1 = (dVar1 * dVar3) / 3600.0 + EPU1;
LAB_00108d3b:
      fluiddira = fmod_360_rad2deg(1.5707963267948966 - psiawind);
      fluidspeeda = vawind;
      dVar1 = Center((interval *)&psitwindhat);
      fluiddir = fmod_360_rad2deg(1.5707963267948966 - dVar1);
      fluidspeed = Center((interval *)&vtwindhat);
    }
    dVar1 = sog;
    if (local_878 != (FILE *)0x0) {
      local_830 = local_830 + local_850;
      local_838 = lathat;
      local_840 = longhat;
      local_848 = althat;
      local_828._0_8_ = altitude_AGL;
      local_850 = pressure_mes;
      local_590 = fluiddira;
      local_598 = fluidspeeda;
      local_5a0 = fluiddir;
      local_5a8 = fluidspeed;
      local_5b0 = d_mes;
      local_5b8 = fmod_360_rad2deg(alpha_mes);
      local_5c0 = utc;
      local_5c8 = local_858;
      local_5d0 = Center((interval *)&xhat);
      local_5d8 = Center((interval *)&yhat);
      local_5e0 = Center((interval *)&zhat);
      local_5e8 = Center((interval *)&phihat);
      local_5f0 = Center((interval *)&thetahat);
      local_5f8 = Center((interval *)&psihat);
      local_600 = Center((interval *)&vrxhat);
      local_608 = Center((interval *)&vryhat);
      local_610 = Center((interval *)&vrzhat);
      local_618 = Center((interval *)&omegaxhat);
      local_620 = Center((interval *)&omegayhat);
      local_628 = Center((interval *)&omegazhat);
      local_630 = Center((interval *)&accrxhat);
      local_638 = Center((interval *)&accryhat);
      local_640 = Center((interval *)&accrzhat);
      local_518 = 2.0;
      interval::interval((interval *)&Vr,&local_518);
      operator/((interval *)&xhat,(interval *)&Vr);
      local_648 = Width((interval *)&R_Euler);
      local_520 = 2.0;
      interval::interval((interval *)&p,&local_520);
      operator/((interval *)&yhat,(interval *)&p);
      local_650 = Width((interval *)&pdot);
      local_528 = 2.0;
      interval::interval(&local_870,&local_528);
      operator/((interval *)&zhat,&local_870);
      local_658 = Width(&local_898);
      local_530 = 2.0;
      interval::interval(&local_808,&local_530);
      operator/((interval *)&phihat,&local_808);
      local_660 = Width(&local_7f0);
      local_538 = 2.0;
      interval::interval(&local_258,&local_538);
      operator/((interval *)&thetahat,&local_258);
      local_668 = Width(&local_7c0);
      local_540 = 2.0;
      interval::interval(&local_288,&local_540);
      operator/((interval *)&psihat,&local_288);
      local_670 = Width(&local_270);
      local_548 = 2.0;
      interval::interval(&local_2b8,&local_548);
      operator/((interval *)&vrxhat,&local_2b8);
      local_678 = Width(&local_2a0);
      local_550 = 2.0;
      interval::interval(&local_2e8,&local_550);
      operator/((interval *)&vryhat,&local_2e8);
      local_680 = Width(&local_2d0);
      local_558 = 2.0;
      interval::interval(&local_318,&local_558);
      operator/((interval *)&vrzhat,&local_318);
      local_688 = Width(&local_300);
      local_560 = 2.0;
      interval::interval(&local_348,&local_560);
      operator/((interval *)&omegaxhat,&local_348);
      local_690 = Width(&local_330);
      local_568 = 2.0;
      interval::interval(&local_378,&local_568);
      operator/((interval *)&omegayhat,&local_378);
      local_698 = Width(&local_360);
      local_570 = 2.0;
      interval::interval(&local_3a8,&local_570);
      operator/((interval *)&omegazhat,&local_3a8);
      local_6a0 = Width(&local_390);
      local_578 = 2.0;
      interval::interval(&local_3d8,&local_578);
      operator/((interval *)&accrxhat,&local_3d8);
      local_6a8 = Width(&local_3c0);
      local_580 = 2.0;
      interval::interval(&local_408,&local_580);
      operator/((interval *)&accryhat,&local_408);
      local_6b0 = Width(&local_3f0);
      local_588 = 2.0;
      interval::interval(&local_438,&local_588);
      operator/((interval *)&accrzhat,&local_438);
      local_6b8 = Width(&local_420);
      pFVar8 = local_878;
      local_6c0 = wx;
      local_6c8 = wy;
      local_6d0 = wz;
      local_6d8 = wphi;
      local_6e0 = wtheta;
      local_6e8 = wpsi;
      local_6f0 = wd;
      local_6f8 = wu;
      local_700 = wagl;
      local_708 = u_f;
      local_710 = ul_f;
      local_718 = uv_f;
      local_720 = ur_f;
      local_728 = up_f;
      local_730 = uw_f;
      fprintf(local_878,
              "%f;%.8f;%.8f;%.3f;%.2f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%.3f;%.3f;%.3f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%.3f;%.3f;%.3f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%.3f;%.3f;\n"
              ,SUB84(local_830,0),local_838,local_840,local_848,local_880,dVar2,dVar1,
              local_828._0_8_);
      fflush(pFVar8);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
  } while (bExit == 0);
  StopChronoQuick(&chrono_omegaz);
  StopChronoQuick(&chrono_v);
  StopChrono(&chrono,&local_858);
  if (local_878 != (FILE *)0x0) {
    fclose(local_878);
  }
LAB_00109baa:
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE ObserverThread(void* pParam)
{
	CHRONO chrono;
	CHRONO chrono_v;
	CHRONO chrono_omegaz;
	double dt = 0, t = 0, t0 = 0, t_epoch = 0;
	struct timeval tv;
	//double dt_chrono = 0;
	//interval xhat_prev_old, yhat_prev_old, psihat_prev_old;
	double cosfilteredwinddir = 0, sinfilteredwinddir = 0;
	double lathat = 0, longhat = 0, althat = 0, headinghat = 0, coghat = 0;

	FILE* logstatefile = NULL;
	char logstatefilename[MAX_BUF_LEN];

	UNREFERENCED_PARAMETER(pParam);

	if (!bDisablelogstate)
	{
		EnterCriticalSection(&strtimeCS);
		sprintf(logstatefilename, LOG_FOLDER"logstate_%.64s.csv", strtimeex_fns());
		LeaveCriticalSection(&strtimeCS);
		logstatefile = fopen(logstatefilename, "w");
		if (logstatefile == NULL)
		{
			printf("Unable to create log file.\n");
			if (!bExit) bExit = TRUE; // Unexpected program exit...
			return 0;
		}

		fprintf(logstatefile,
			"t_epoch (in s);lat;lon;alt_amsl;hdg;cog;sog;alt_agl;pressure (in bar);fluiddira (in deg);fluidspeeda;fluiddir (in deg);fluidspeed;range;bearing (in deg);elevation (in deg);utc (in ms);"
			"t_app (in s);xhat;yhat;zhat;phihat;thetahat;psihat;vrxhat;vryhat;vrzhat;omegaxhat;omegayhat;omegazhat;accrxhat;accryhat;accrzhat;"
			"xhat_err;yhat_err;zhat_err;phihat_err;thetahat_err;psihat_err;vrxhat_err;vryhat_err;vrzhat_err;omegaxhat_err;omegayhat_err;omegazhat_err;accrxhat_err;accryhat_err;accrzhat_err;"
			"wx;wy;wz;wphi;wtheta;wpsi;wd;wu;wagl;"
			"uvx;uvy;uvz;uwx;uwy;uwz;u1;u2;u3;u4;u5;u6;u7;u8;u9;u10;u11;u12;u13;u14;"
			"EPU1;EPU2;\n"
		);
		fflush(logstatefile);
	}

	EnterCriticalSection(&StateVariablesCS);
	psitwind = psitwind_med;
	vtwind = vtwind_med;

	// Initialize wind data filter. Should take some time before getting a correct value...
	cosfilteredwinddir = cos(psitwind);
	sinfilteredwinddir = sin(psitwind);
	psitwindhat = fmod_2PI(atan2(sinfilteredwinddir,cosfilteredwinddir));
	vtwindhat = vtwind;
	LeaveCriticalSection(&StateVariablesCS);

	// GPS localization enabled by default, use enable/disableautogpslocalization commands to enable/disable...
	bGPSLocalization = TRUE;

	// DVL localization enabled by default, use enable/disableautodvllocalization commands to enable/disable...
	bDVLLocalization = TRUE;

	t = 0;

	StartChrono(&chrono);
	StartChrono(&chrono_v);
	StartChrono(&chrono_omegaz);

	for (;;)
	{
		uSleep(1000*observerperiod);
		t0 = t;
		GetTimeElapsedChrono(&chrono, &t);
		dt = t-t0;

		//printf("ObserverThread period : %f s.\n", dt);

		if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }
		t_epoch = tv.tv_sec+0.000001*tv.tv_usec;
		//utc = 1000.0*tv.tv_sec+0.001*tv.tv_usec;

		EnterCriticalSection(&StateVariablesCS);

		interval xhat_prev = xhat;
		interval yhat_prev = yhat;
		interval zhat_prev = zhat;
		interval psihat_prev = psihat;
		interval vrxhat_prev = vrxhat;
		interval omegazhat_prev = omegazhat;

		vchat = interval(vc_med-vc_var,vc_med+vc_var);
		psichat = interval(psic_med-psic_var,psic_med+psic_var);
		hwhat = interval(-hw_var,hw_var);

		// Wind data filter.
		cosfilteredwinddir = wind_filter_coef*cosfilteredwinddir+(1.0-wind_filter_coef)*cos(psitwind);
		sinfilteredwinddir = wind_filter_coef*sinfilteredwinddir+(1.0-wind_filter_coef)*sin(psitwind);
		psitwindhat = fmod_2PI(atan2(sinfilteredwinddir,cosfilteredwinddir))+interval(-psitwind_var,psitwind_var); // Bounds might go outside modulo...
		vtwindhat = wind_filter_coef*Center(vtwindhat)+(1.0-wind_filter_coef)*vtwind+interval(-vtwind_var,vtwind_var);

		// Temporary...
		switch (psi_source)
		{
		case 2:
			psihat = (sog >= GPS_SOG_for_valid_COG)? psi_dvl: psi_ahrs; // Temp...
			break;
		case 1:
			psihat = (sog >= GPS_SOG_for_valid_COG)? cog_gps: psi_ahrs;
			break;
		case 0:
		default:
			psihat = psi_ahrs;
			break;
		}
		omegaxhat = omegax_ahrs;
		omegayhat = omegay_ahrs;
		//omegazhat = omegaz_ahrs;
		accrxhat = accrx_ahrs;
		accryhat = accry_ahrs;
		accrzhat = accrz_ahrs;

		if (robid & SUBMARINE_ROBID_MASK)
		{
			if ((bDVLLocalization)&&((Width(vrx_dvl) <= 4*dvl_acc)&&(Width(vry_dvl) <= 4*dvl_acc)))
			{
				// State observer using DVL and AHRS data...
				vrxhat = vrx_dvl;
				vryhat = vry_dvl;
				vrzhat = vrz_dvl;
				zhat = z_pressure+hwhat; // Waves influence...
				phihat = phi_ahrs;
				thetahat = theta_ahrs;

				imatrix R_Euler = RotationPhiThetaPsi(phihat, thetahat, psihat);
				box Vr = box(vrxhat, vryhat, vrzhat);
				box pdot = R_Euler*Vr;
				box p = box(xhat, yhat, zhat);
				p = p+dt*pdot;
				xhat = p[1];
				yhat = p[2];

				//imatrix R_Euler = RotationPhiThetaPsi(phihat, thetahat, psihat);
				//box Vr = box(vrxhat, vryhat, vrzhat);
				//rmatrix p = Zeros(3,1);
				//p.SetVal(1, 1, Center(xhat));
				//p.SetVal(2, 1, Center(yhat));
				//p.SetVal(3, 1, Center(zhat));
				//p = p+dt*Center(R_Euler)*rmatrix(Vr);
				//xhat = p.GetVal(1, 1);
				//yhat = p.GetVal(2, 1);
			}
			else
			{
				// State observer (just dead reckoning simulator...).
				xhat = xhat+dt*(vrxhat*Cos(psihat)+vchat*Cos(psichat)+xdotnoise);
				yhat = yhat+dt*(vrxhat*Sin(psihat)+vchat*Sin(psichat)+ydotnoise);
				//zhat = Min(zhat+dt*(u3*alphazhat+vzuphat+zdotnoise),interval(0.0)); // z always negative.
				//zhat = zhat & (z_pressure+hwhat);
				zhat = z_pressure+hwhat; // Waves influence...
				//psihat = psihat+dt*((u1-u2)*alphaomegazhat+psidotnoise);
				phihat = phi_ahrs;
				thetahat = theta_ahrs;
				vrxhat = (
					(1.0-dt*alphafvrxhat)*vrxhat
					+dt*(u1+u2)*alphavrxhat
					+dt*vrxdotnoise
					); // Factorization.
				// Should add vc,psic estimation influence in v?
			}

			// SAUC'ISSE, SARDINE, BLUEROV, LIRMIA3 can measure omegaz.
			if ((robid & SAUCISSE_CLASS_ROBID_MASK)||(robid == BLUEROV_ROBID)||(robid == LIRMIA3_ROBID))
			{
				omegazhat = omegaz_ahrs;
			}
			else if (robid == SUBMARINE_SIMULATOR_ROBID)
			{
				omegazhat = dt*((u1-u2)*alphaomegazhat+psidotnoise); // Why dt*...???

				//omegazhat = (
				//	(1.0-dt*alphafomegazhat)*omegazhat
				//	+dt*(u1-u2)*alphaomegazhat
				//	+dt*omegazdotnoise
				//	); // Factorization.
			}
			else
			{
				// To handle modulo 2pi problems, we should use the following :
				//omegazhat = sin(Center(psihat)-Center(psihat_prev))/dt+interval(-omegaz_ahrs_acc,+omegaz_ahrs_acc);

				//GetTimeElapsedChrono(&chrono_omegaz, &dt_chrono);
				//if (dt_chrono > 0.5)
				//{
				//	omegazhat = sin(Center(psihat)-Center(psihat_prev_old))/dt_chrono+interval(-omegaz_ahrs_acc,+omegaz_ahrs_acc);
				//	StopChronoQuick(&chrono_omegaz);
				//	StartChrono(&chrono_omegaz);
				//	psihat_prev_old = psihat;
				//}
				omegazhat = 0.8*omegazhat+0.2*(sin(Center(psihat)-Center(psihat_prev))/dt+interval(-omegaz_ahrs_acc,+omegaz_ahrs_acc));

				//printf("omegazhat = %f\n", Center(omegazhat));
			}
			if ((bGPSLocalization)&&(bCheckGNSSOK())&&(Center(zhat) > GPS_submarine_depth_limit))
			{
				// Should add speed...?
				xhat = xhat & x_gps;
				yhat = yhat & y_gps;
				if (xhat.isEmpty || yhat.isEmpty)
				{
					xhat = x_gps;
					yhat = y_gps;
				}
			}
		}
		else if (robid == ETAS_WHEEL_ROBID)
		{
			xhat = xhat+dt*(alphavrxhat*(u1+u2)*Cos(psihat)+xdotnoise);
			yhat = yhat+dt*(alphavrxhat*(u1+u2)*Sin(psihat)+ydotnoise);
			zhat = interval(-5*GPS_low_acc,5*GPS_low_acc);
			phihat = phi_ahrs;
			thetahat = theta_ahrs;
			vrxhat = sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise;
			omegazhat = omegaz_ahrs;
			if ((bGPSLocalization)&&(bCheckGNSSOK()))
			{
				// Should add speed...?
				xhat = xhat & x_gps;
				yhat = yhat & y_gps;
				zhat = zhat & z_gps;
				if (xhat.isEmpty || yhat.isEmpty)
				{
					xhat = x_gps;
					yhat = y_gps;
				}
				if (zhat.isEmpty) zhat = z_gps;
			}
		}
		else if (robid == BUBBLE_ROBID)
		{
			//// Temp...
			//xhat = xhat+dt*(vrxhat*Cos(psihat)+vchat*Cos(psichat)+xdotnoise);
			//yhat = yhat+dt*(vrxhat*Sin(psihat)+vchat*Sin(psichat)+ydotnoise);
			//zhat = interval(-5*GPS_low_acc,5*GPS_low_acc);
			//vrxhat = (
			//	(1.0-dt*alphafvrxhat)*vrxhat
			//	+dt*(u1+u2)*alphavrxhat
			//	+dt*vrxdotnoise
			//	); // Factorization.
			//// Should add vc,psic estimation influence in v?
			//omegazhat = interval(omegaz_mes-omegaz_ahrs_acc,omegaz_mes+omegaz_ahrs_acc);

			xhat = x_gps;
			yhat = y_gps;
			zhat = z_gps;
			phihat = phi_ahrs;
			thetahat = theta_ahrs;
			vrxhat = sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise;
			omegazhat = omegaz_ahrs;

			//GetTimeElapsedChrono(&chrono_v, &dt_chrono);
			//if (dt_chrono > 1)
			//{
			//	vrxhat = sqrt(sqr(Center(xhat-xhat_prev_old))+sqr(Center(yhat-yhat_prev_old)))/dt_chrono+vrxdotnoise;
			//	StopChronoQuick(&chrono_v);
			//	StartChrono(&chrono_v);
			//	xhat_prev_old = xhat;
			//	yhat_prev_old = yhat;
			//}
			//vrxhat = 0.9*vrxhat+0.1*(sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise);
			//printf("vrxhat = %f\n", Center(vrxhat));
		}
		else if ((robid == BUGGY_SIMULATOR_ROBID)||(robid == BUGGY_ROBID))
		{
			xhat = xhat+dt*(alphavrxhat*u_f*Cos(psihat)*Cos(alphaomegazhat*uw_f)+xdotnoise);
			yhat = yhat+dt*(alphavrxhat*u_f*Sin(psihat)*Cos(alphaomegazhat*uw_f)+ydotnoise);
			zhat = interval(-5*GPS_low_acc,5*GPS_low_acc);
			phihat = phi_ahrs;
			thetahat = theta_ahrs;
			vrxhat = sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise;
			omegazhat = omegaz_ahrs;
			if ((bGPSLocalization)&&(bCheckGNSSOK()))
			{
				// Should add speed...?
				xhat = xhat & x_gps;
				yhat = yhat & y_gps;
				zhat = zhat & z_gps;
				if (xhat.isEmpty || yhat.isEmpty)
				{
					xhat = x_gps;
					yhat = y_gps;
				}
				if (zhat.isEmpty) zhat = z_gps;
			}
		}
		else if ((robid == MOTORBOAT_SIMULATOR_ROBID)||(robid == MOTORBOAT_ROBID))
		{
			//// Temp...
			//xhat = xhat+dt*(alphavrxhat*u_f*Cos(psihat)*Cos(alphaomegazhat*uw_f)+xdotnoise);
			//yhat = yhat+dt*(alphavrxhat*u_f*Sin(psihat)*Cos(alphaomegazhat*uw_f)+ydotnoise);
			//zhat = interval(-5*GPS_low_acc,5*GPS_low_acc);
			//vrxhat = sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise;
			//omegazhat = interval(omegaz_mes-omegaz_ahrs_acc,omegaz_mes+omegaz_ahrs_acc);

			xhat = x_gps;
			yhat = y_gps;
			zhat = z_gps;
			phihat = phi_ahrs;
			thetahat = theta_ahrs;
			vrxhat = sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise;
			omegazhat = omegaz_ahrs;

			//GetTimeElapsedChrono(&chrono_v, &dt_chrono);
			//if (dt_chrono > 1)
			//{
			//	vrxhat = sqrt(sqr(Center(xhat-xhat_prev_old))+sqr(Center(yhat-yhat_prev_old)))/dt_chrono+vrxdotnoise;
			//	StopChronoQuick(&chrono_v);
			//	StartChrono(&chrono_v);
			//	xhat_prev_old = xhat;
			//	yhat_prev_old = yhat;
			//}
			//vrxhat = 0.9*vrxhat+0.1*(sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise);
			//printf("vrxhat = %f\n", Center(vrxhat));
		}
		else if (robid == ARDUCOPTER_ROBID)
		{
			vrxhat = vrx_of;
			vryhat = vry_of;
			xhat = xhat+dt*(vrx_of*Cos(psihat)-vry_of*Sin(psihat)+xdotnoise);
			yhat = yhat+dt*(vrx_of*Sin(psihat)+vry_of*Cos(psihat)+ydotnoise);
			zhat = interval(-5*GPS_low_acc,5*GPS_low_acc);
			phihat = phi_ahrs;
			thetahat = theta_ahrs;
			//vrxhat = sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise;
			vrzhat = (Center(zhat-zhat_prev))/dt+vrzdotnoise;
			omegazhat = omegaz_ahrs;
			if ((bGPSLocalization)&&(bCheckGNSSOK()))
			{
				// Should add speed...?
				xhat = xhat & x_gps;
				yhat = yhat & y_gps;
				zhat = zhat & z_gps;
				if (xhat.isEmpty || yhat.isEmpty)
				{
					xhat = x_gps;
					yhat = y_gps;
				}
				if (zhat.isEmpty) zhat = z_gps;
			}
		}
		else
		{
			xhat = x_gps;
			yhat = y_gps;
			zhat = z_gps;
			phihat = phi_ahrs;
			thetahat = theta_ahrs;
			vrxhat = sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise;
			omegazhat = omegaz_ahrs;

			//GetTimeElapsedChrono(&chrono_v, &dt_chrono);
			//if (dt_chrono > 1)
			//{
			//	vrxhat = sqrt(sqr(Center(xhat-xhat_prev_old))+sqr(Center(yhat-yhat_prev_old)))/dt_chrono+vrxdotnoise;
			//	StopChronoQuick(&chrono_v);
			//	StartChrono(&chrono_v);
			//	xhat_prev_old = xhat;
			//	yhat_prev_old = yhat;
			//}
			//vrxhat = 0.9*vrxhat+0.1*(sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise);
			//printf("vrxhat = %f\n", Center(vrxhat));
		}

		EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, Center(xhat), Center(yhat), Center(zhat), &lathat, &longhat, &althat);
		headinghat = fmod_360_pos_rad2deg(-angle_env-Center(psihat)+M_PI/2.0);
		coghat = fmod_360_pos_rad2deg(-angle_env-Center(cog_gps)+M_PI/2.0);

		switch (robid)
		{
		case SUBMARINE_SIMULATOR_ROBID:
		case SAUCISSE_ROBID:
		case SARDINE_ROBID:
		case CISCREA_ROBID:
			if (vbat1 != 0) EPU1 += dt*(vbat1_filtered*ibat1_filtered)/3600.0;
			else EPU1 += dt*(P_electronics_4)/3600.0;
			if (vbat2 != 0) EPU2 += dt*(vbat2_filtered*ibat2_filtered)/3600.0;
			else EPU2 += dt*((u1+u2+u3)*P_actuators_1+P_actuators_4)/3600.0;
			break;
		case VAIMOS_ROBID:
			if (vbat1 != 0) EPU1 += dt*(vbat1_filtered*ibat1_filtered)/3600.0;
			else EPU1 += dt*(P_electronics_4+P_actuators_4)/3600.0;
			break;
		case SAILBOAT_SIMULATOR_ROBID:
		case SAILBOAT_ROBID:
		case SAILBOAT2_ROBID:
			if (vbat1 != 0) EPU1 += dt*(vbat1_filtered*ibat1_filtered)/3600.0;
			else EPU1 += dt*(P_electronics_4)/3600.0;
			if (vbat2 != 0) EPU2 += dt*(vbat2_filtered*ibat2_filtered)/3600.0;
			else EPU2 += dt*(P_actuators_4)/3600.0;
			break;
		case MOTORBOAT_SIMULATOR_ROBID:
		case MOTORBOAT_ROBID:
		case BUGGY_SIMULATOR_ROBID:
		case BUGGY_ROBID:
			if (vbat1 != 0) EPU1 += dt*(vbat1_filtered*ibat1_filtered)/3600.0;
			else EPU1 += dt*(P_electronics_4)/3600.0;
			if (vbat2 != 0) EPU2 += dt*(vbat2_filtered*ibat2_filtered)/3600.0;
			else EPU2 += dt*(u_f*P_actuators_1+uw_f*P_actuators_2+P_actuators_4)/3600.0;
			break;
		case BUBBLE_ROBID:
		case TANK_SIMULATOR_ROBID:
		case ETAS_WHEEL_ROBID:
			if (vbat1 != 0) EPU1 += dt*(vbat1_filtered*ibat1_filtered)/3600.0;
			else EPU1 += dt*(P_electronics_4)/3600.0;
			if (vbat2 != 0) EPU2 += dt*(vbat2_filtered*ibat2_filtered)/3600.0;
			else EPU2 += dt*((u1+u2)*P_actuators_1+P_actuators_4)/3600.0;
			break;
		case QUADRO_SIMULATOR_ROBID:
		case COPTER_ROBID:
		case ARDUCOPTER_ROBID:
		default:
			if (vbat1 != 0) EPU1 += dt*(vbat1_filtered*ibat1_filtered)/3600.0;
			else EPU1 += dt*(P_electronics_4)/3600.0;
			if (vbat2 != 0) EPU2 += dt*(vbat2_filtered*ibat2_filtered)/3600.0;
			else EPU2 += dt*((u_f+uw_f+uv_f+ul_f)*P_actuators_1+P_actuators_4)/3600.0;
			break;
		}

		switch (robid)
		{
		case VAIMOS_ROBID:
		case SAILBOAT_ROBID:
		case SAILBOAT2_ROBID:
		case MOTORBOAT_ROBID:
		case BUBBLE_ROBID:
			fluiddira = fmod_360_rad2deg(M_PI/2-psiawind);
			fluidspeeda = vawind;
			fluiddir = fmod_360_rad2deg(M_PI/2-Center(psitwindhat));
			fluidspeed = Center(vtwindhat);
			break;
		case QUADRO_SIMULATOR_ROBID:
		case COPTER_ROBID:
		case ARDUCOPTER_ROBID:
		default:
			break;
		}

		if (logstatefile)
		{
			fprintf(logstatefile,
				"%f;%.8f;%.8f;%.3f;%.2f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%f;%.3f;%.3f;%.3f;%f;%f;%f;"
				"%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%.3f;%.3f;%.3f;%f;%f;%f;"
				"%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%.3f;%.3f;\n",
				t_epoch, lathat, longhat, althat, headinghat, coghat, sog, altitude_AGL, pressure_mes, fluiddira, fluidspeeda, fluiddir, fluidspeed, d_mes, fmod_360_rad2deg(alpha_mes), 0.0, utc,
				t, Center(xhat), Center(yhat), Center(zhat), Center(phihat), Center(thetahat), Center(psihat),
				Center(vrxhat), Center(vryhat), Center(vrzhat), Center(omegaxhat), Center(omegayhat), Center(omegazhat), Center(accrxhat), Center(accryhat), Center(accrzhat),
				Width(xhat/2.0), Width(yhat/2.0), Width(zhat/2.0), Width(phihat/2.0), Width(thetahat/2.0), Width(psihat/2.0),
				Width(vrxhat/2.0), Width(vryhat/2.0), Width(vrzhat/2.0), Width(omegaxhat/2.0), Width(omegayhat/2.0), Width(omegazhat/2.0), Width(accrxhat/2.0), Width(accryhat/2.0), Width(accrzhat/2.0),
				wx, wy, wz, wphi, wtheta, wpsi, wd, wu, wagl,
				u_f, ul_f, uv_f, ur_f, up_f, uw_f, u1, u2, u3, u4, u5, u6, u7, u8, u9, u10, u11, u12, u13, u14,
				EPU1, EPU2);
			fflush(logstatefile);
		}

		LeaveCriticalSection(&StateVariablesCS);

		if (bExit) break;
	}

	StopChronoQuick(&chrono_omegaz);
	StopChronoQuick(&chrono_v);
	StopChrono(&chrono, &t);

	if (logstatefile)
	{
		fclose(logstatefile);
	}

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}